

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

bool __thiscall
cmake::SetCacheArgs(cmake *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *args)

{
  DiagLevel DVar1;
  cmState *pcVar2;
  bool bVar3;
  bool bVar4;
  size_type sVar5;
  long lVar6;
  ulong uVar7;
  const_reference pvVar8;
  char *pcVar9;
  ostream *poVar10;
  mapped_type *pmVar11;
  DiagLevel *pDVar12;
  reference pbVar13;
  string local_2f8 [8];
  string path_1;
  string path;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2b0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2a8;
  const_iterator currentEntry;
  iterator iStack_298;
  CacheEntryType t;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_290;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_288;
  const_iterator it;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cacheKeys;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entriesToDelete;
  undefined1 local_230 [8];
  RegularExpression regex;
  string entryPattern;
  string local_138 [32];
  int local_118;
  byte local_112;
  byte local_111;
  uint nameStartPosition;
  bool foundError;
  bool foundNo;
  string name;
  string entry_1;
  char *v;
  string cachedValue;
  undefined1 local_a0 [3];
  bool haveValue;
  CacheEntryType type;
  string value;
  string var;
  undefined1 local_50 [8];
  string entry;
  string *arg;
  uint i;
  bool findPackageMode;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmake *this_local;
  
  bVar3 = false;
  arg._0_4_ = 1;
  do {
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(args);
    if (sVar5 <= (uint)arg) {
      if (bVar3) {
        this_local._7_1_ = FindPackage(this,args);
      }
      else {
        this_local._7_1_ = 1;
      }
LAB_004fd0ec:
      return (bool)(this_local._7_1_ & 1);
    }
    entry.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::operator[](args,(ulong)(uint)arg);
    lVar6 = std::__cxx11::string::find((char *)entry.field_2._8_8_,0xa1cfd7);
    if (lVar6 == 0) {
      std::__cxx11::string::substr((ulong)local_50,entry.field_2._8_8_);
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) == 0) {
LAB_004fc38e:
        std::__cxx11::string::string((string *)(value.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)local_a0);
        cachedValue.field_2._12_4_ = 6;
        bVar4 = cmState::ParseCacheEntry
                          ((string *)local_50,(string *)(value.field_2._M_local_buf + 8),
                           (string *)local_a0,
                           (CacheEntryType *)(cachedValue.field_2._M_local_buf + 0xc));
        if (bVar4) {
          cachedValue.field_2._M_local_buf[0xb] = '\0';
          std::__cxx11::string::string((string *)&v);
          if (((this->WarnUnusedCli & 1U) != 0) &&
             (pcVar9 = cmState::GetInitializedCacheValue
                                 (this->State,(string *)((long)&value.field_2 + 8)),
             pcVar9 != (char *)0x0)) {
            cachedValue.field_2._M_local_buf[0xb] = '\x01';
            std::__cxx11::string::operator=((string *)&v,pcVar9);
          }
          pcVar9 = (char *)std::__cxx11::string::c_str();
          AddCacheEntry(this,(string *)((long)&value.field_2 + 8),pcVar9,
                        "No help, variable specified on the command line.",
                        cachedValue.field_2._12_4_);
          if ((this->WarnUnusedCli & 1U) != 0) {
            if ((cachedValue.field_2._M_local_buf[0xb] & 1U) != 0) {
              pcVar9 = cmState::GetInitializedCacheValue
                                 (this->State,(string *)((long)&value.field_2 + 8));
              bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&v,pcVar9);
              if (!bVar4) goto LAB_004fc542;
            }
            WatchUnusedCli(this,(string *)((long)&value.field_2 + 8));
          }
LAB_004fc542:
          std::__cxx11::string::~string((string *)&v);
          bVar4 = false;
        }
        else {
          poVar10 = std::operator<<((ostream *)&std::cerr,"Parse error in command line argument: ");
          poVar10 = std::operator<<(poVar10,(string *)entry.field_2._8_8_);
          poVar10 = std::operator<<(poVar10,"\n");
          std::operator<<(poVar10,"Should be: VAR:type=value\n");
          cmSystemTools::Error("No cmake script provided.",(char *)0x0,(char *)0x0,(char *)0x0);
          this_local._7_1_ = 0;
          bVar4 = true;
        }
        std::__cxx11::string::~string((string *)local_a0);
        std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
      }
      else {
        arg._0_4_ = (uint)arg + 1;
        sVar5 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(args);
        if ((uint)arg < sVar5) {
          pvVar8 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](args,(ulong)(uint)arg);
          std::__cxx11::string::operator=((string *)local_50,(string *)pvVar8);
          goto LAB_004fc38e;
        }
        cmSystemTools::Error
                  ("-D must be followed with VAR=VALUE.",(char *)0x0,(char *)0x0,(char *)0x0);
        this_local._7_1_ = 0;
        bVar4 = true;
      }
      std::__cxx11::string::~string((string *)local_50);
      if (bVar4) goto LAB_004fd0ec;
    }
    else {
      bVar4 = cmHasLiteralPrefix<std::__cxx11::string,3ul>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         entry.field_2._8_8_,(char (*) [3])"-W");
      if (bVar4) {
        std::__cxx11::string::substr((ulong)((long)&name.field_2 + 8),entry.field_2._8_8_);
        uVar7 = std::__cxx11::string::empty();
        if ((uVar7 & 1) == 0) {
LAB_004fc70a:
          std::__cxx11::string::string((string *)&nameStartPosition);
          local_111 = 0;
          local_112 = 0;
          local_118 = 0;
          lVar6 = std::__cxx11::string::find(name.field_2._M_local_buf + 8,0xa1d0b4);
          if (lVar6 == 0) {
            local_111 = 1;
            local_118 = local_118 + 3;
          }
          lVar6 = std::__cxx11::string::find(name.field_2._M_local_buf + 8,0xa1d0b8);
          if (lVar6 == 0) {
            local_112 = 1;
            local_118 = local_118 + 6;
          }
          std::__cxx11::string::substr((ulong)local_138,(ulong)((long)&name.field_2 + 8));
          std::__cxx11::string::operator=((string *)&nameStartPosition,local_138);
          std::__cxx11::string::~string(local_138);
          uVar7 = std::__cxx11::string::empty();
          if ((uVar7 & 1) == 0) {
            if (((local_111 & 1) == 0) && ((local_112 & 1) == 0)) {
              pmVar11 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                        ::operator[](&this->DiagLevels,(key_type *)&nameStartPosition);
              entryPattern.field_2._12_4_ = 1;
              pDVar12 = std::max<cmake::DiagLevel>
                                  (pmVar11,(DiagLevel *)(entryPattern.field_2._M_local_buf + 0xc));
              DVar1 = *pDVar12;
              pmVar11 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                        ::operator[](&this->DiagLevels,(key_type *)&nameStartPosition);
              *pmVar11 = DVar1;
            }
            else if (((local_111 & 1) == 0) || ((local_112 & 1) != 0)) {
              if (((local_111 & 1) == 0) && ((local_112 & 1) != 0)) {
                pmVar11 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                          ::operator[](&this->DiagLevels,(key_type *)&nameStartPosition);
                *pmVar11 = DIAG_ERROR;
              }
              else {
                pmVar11 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                          ::operator[](&this->DiagLevels,(key_type *)&nameStartPosition);
                entryPattern.field_2._8_4_ = 1;
                pDVar12 = std::min<cmake::DiagLevel>
                                    (pmVar11,(DiagLevel *)(entryPattern.field_2._M_local_buf + 8));
                DVar1 = *pDVar12;
                pmVar11 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                          ::operator[](&this->DiagLevels,(key_type *)&nameStartPosition);
                *pmVar11 = DVar1;
              }
            }
            else {
              pmVar11 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                        ::operator[](&this->DiagLevels,(key_type *)&nameStartPosition);
              *pmVar11 = DIAG_IGNORE;
            }
            bVar4 = false;
          }
          else {
            cmSystemTools::Error("No warning name provided.",(char *)0x0,(char *)0x0,(char *)0x0);
            this_local._7_1_ = 0;
            bVar4 = true;
          }
          std::__cxx11::string::~string((string *)&nameStartPosition);
        }
        else {
          arg._0_4_ = (uint)arg + 1;
          sVar5 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(args);
          if ((uint)arg < sVar5) {
            pvVar8 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](args,(ulong)(uint)arg);
            std::__cxx11::string::operator=
                      ((string *)(name.field_2._M_local_buf + 8),(string *)pvVar8);
            goto LAB_004fc70a;
          }
          cmSystemTools::Error
                    ("-W must be followed with [no-]<name>.",(char *)0x0,(char *)0x0,(char *)0x0);
          this_local._7_1_ = 0;
          bVar4 = true;
        }
        std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
        if (bVar4) goto LAB_004fd0ec;
      }
      else {
        lVar6 = std::__cxx11::string::find((char *)entry.field_2._8_8_,0xa1d0d9);
        if (lVar6 == 0) {
          std::__cxx11::string::substr((ulong)&regex.searchstring,entry.field_2._8_8_);
          uVar7 = std::__cxx11::string::empty();
          if ((uVar7 & 1) == 0) {
LAB_004fcb02:
            cmsys::Glob::PatternToRegex
                      ((string *)
                       &entriesToDelete.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (string *)&regex.searchstring,true,true);
            pcVar9 = (char *)std::__cxx11::string::c_str();
            cmsys::RegularExpression::RegularExpression((RegularExpression *)local_230,pcVar9);
            std::__cxx11::string::~string
                      ((string *)
                       &entriesToDelete.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&cacheKeys.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
            cmState::GetCacheEntryKeys_abi_cxx11_
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&it,this->State);
            local_290._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&it);
            __gnu_cxx::
            __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ::__normal_iterator<std::__cxx11::string*>
                      ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        *)&local_288,&local_290);
            while( true ) {
              iStack_298 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&it);
              bVar4 = __gnu_cxx::operator!=(&local_288,&stack0xfffffffffffffd68);
              if (!bVar4) break;
              pcVar2 = this->State;
              pbVar13 = __gnu_cxx::
                        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator*(&local_288);
              currentEntry._M_current._4_4_ = cmState::GetCacheEntryType(pcVar2,pbVar13);
              if (currentEntry._M_current._4_4_ != STATIC) {
                __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator->(&local_288);
                pcVar9 = (char *)std::__cxx11::string::c_str();
                bVar4 = cmsys::RegularExpression::find((RegularExpression *)local_230,pcVar9);
                if (bVar4) {
                  pbVar13 = __gnu_cxx::
                            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator*(&local_288);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&cacheKeys.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,pbVar13);
                }
              }
              __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&local_288);
            }
            local_2b0._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&cacheKeys.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
            __gnu_cxx::
            __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ::__normal_iterator<std::__cxx11::string*>
                      ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        *)&local_2a8,&local_2b0);
            while( true ) {
              path.field_2._8_8_ =
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&cacheKeys.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
              bVar4 = __gnu_cxx::operator!=
                                (&local_2a8,
                                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)((long)&path.field_2 + 8));
              if (!bVar4) break;
              pcVar2 = this->State;
              pbVar13 = __gnu_cxx::
                        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator*(&local_2a8);
              cmState::RemoveCacheEntry(pcVar2,pbVar13);
              __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&local_2a8);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&it);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&cacheKeys.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
            cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_230);
            bVar4 = false;
          }
          else {
            arg._0_4_ = (uint)arg + 1;
            sVar5 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(args);
            if ((uint)arg < sVar5) {
              pvVar8 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](args,(ulong)(uint)arg);
              std::__cxx11::string::operator=((string *)&regex.searchstring,(string *)pvVar8);
              goto LAB_004fcb02;
            }
            cmSystemTools::Error
                      ("-U must be followed with VAR.",(char *)0x0,(char *)0x0,(char *)0x0);
            this_local._7_1_ = 0;
            bVar4 = true;
          }
          std::__cxx11::string::~string((string *)&regex.searchstring);
          if (bVar4) goto LAB_004fd0ec;
        }
        else {
          lVar6 = std::__cxx11::string::find((char *)entry.field_2._8_8_,0xa1d0fa);
          if (lVar6 == 0) {
            std::__cxx11::string::substr((ulong)((long)&path_1.field_2 + 8),entry.field_2._8_8_);
            uVar7 = std::__cxx11::string::empty();
            if ((uVar7 & 1) == 0) {
LAB_004fceb4:
              poVar10 = std::operator<<((ostream *)&std::cout,"loading initial cache file ");
              poVar10 = std::operator<<(poVar10,(string *)(path_1.field_2._M_local_buf + 8));
              std::operator<<(poVar10,"\n");
              pcVar9 = (char *)std::__cxx11::string::c_str();
              ReadListFile(this,args,pcVar9);
              bVar4 = false;
            }
            else {
              arg._0_4_ = (uint)arg + 1;
              sVar5 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size(args);
              if ((uint)arg < sVar5) {
                pvVar8 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[](args,(ulong)(uint)arg);
                std::__cxx11::string::operator=
                          ((string *)(path_1.field_2._M_local_buf + 8),(string *)pvVar8);
                goto LAB_004fceb4;
              }
              cmSystemTools::Error
                        ("-C must be followed by a file name.",(char *)0x0,(char *)0x0,(char *)0x0);
              this_local._7_1_ = 0;
              bVar4 = true;
            }
            std::__cxx11::string::~string((string *)(path_1.field_2._M_local_buf + 8));
            if (bVar4) goto LAB_004fd0ec;
          }
          else {
            lVar6 = std::__cxx11::string::find((char *)entry.field_2._8_8_,0xa1d13d);
            if (lVar6 == 0) {
              arg._0_4_ = (uint)arg + 1;
              sVar5 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size(args);
              if (sVar5 <= (uint)arg) {
                cmSystemTools::Error
                          ("-P must be followed by a file name.",(char *)0x0,(char *)0x0,(char *)0x0
                          );
                this_local._7_1_ = 0;
                goto LAB_004fd0ec;
              }
              pvVar8 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](args,(ulong)(uint)arg);
              std::__cxx11::string::string(local_2f8,(string *)pvVar8);
              uVar7 = std::__cxx11::string::empty();
              bVar4 = (uVar7 & 1) != 0;
              if (bVar4) {
                cmSystemTools::Error
                          ("No cmake script provided.",(char *)0x0,(char *)0x0,(char *)0x0);
                this_local._7_1_ = 0;
              }
              else {
                GetProjectCommandsInScriptMode(this->State);
                pcVar9 = (char *)std::__cxx11::string::c_str();
                ReadListFile(this,args,pcVar9);
              }
              std::__cxx11::string::~string(local_2f8);
              if (bVar4) goto LAB_004fd0ec;
            }
            else {
              lVar6 = std::__cxx11::string::find((char *)entry.field_2._8_8_,0xa1d164);
              if (lVar6 == 0) {
                bVar3 = true;
              }
            }
          }
        }
      }
    }
    arg._0_4_ = (uint)arg + 1;
  } while( true );
}

Assistant:

bool cmake::SetCacheArgs(const std::vector<std::string>& args)
{
  bool findPackageMode = false;
  for (unsigned int i = 1; i < args.size(); ++i) {
    std::string const& arg = args[i];
    if (arg.find("-D", 0) == 0) {
      std::string entry = arg.substr(2);
      if (entry.empty()) {
        ++i;
        if (i < args.size()) {
          entry = args[i];
        } else {
          cmSystemTools::Error("-D must be followed with VAR=VALUE.");
          return false;
        }
      }
      std::string var, value;
      cmStateEnums::CacheEntryType type = cmStateEnums::UNINITIALIZED;
      if (cmState::ParseCacheEntry(entry, var, value, type)) {
        // The value is transformed if it is a filepath for example, so
        // we can't compare whether the value is already in the cache until
        // after we call AddCacheEntry.
        bool haveValue = false;
        std::string cachedValue;
        if (this->WarnUnusedCli) {
          if (const char* v = this->State->GetInitializedCacheValue(var)) {
            haveValue = true;
            cachedValue = v;
          }
        }

        this->AddCacheEntry(var, value.c_str(),
                            "No help, variable specified on the command line.",
                            type);

        if (this->WarnUnusedCli) {
          if (!haveValue ||
              cachedValue != this->State->GetInitializedCacheValue(var)) {
            this->WatchUnusedCli(var);
          }
        }
      } else {
        std::cerr << "Parse error in command line argument: " << arg << "\n"
                  << "Should be: VAR:type=value\n";
        cmSystemTools::Error("No cmake script provided.");
        return false;
      }
    } else if (cmHasLiteralPrefix(arg, "-W")) {
      std::string entry = arg.substr(2);
      if (entry.empty()) {
        ++i;
        if (i < args.size()) {
          entry = args[i];
        } else {
          cmSystemTools::Error("-W must be followed with [no-]<name>.");
          return false;
        }
      }

      std::string name;
      bool foundNo = false;
      bool foundError = false;
      unsigned int nameStartPosition = 0;

      if (entry.find("no-", nameStartPosition) == 0) {
        foundNo = true;
        nameStartPosition += 3;
      }

      if (entry.find("error=", nameStartPosition) == 0) {
        foundError = true;
        nameStartPosition += 6;
      }

      name = entry.substr(nameStartPosition);
      if (name.empty()) {
        cmSystemTools::Error("No warning name provided.");
        return false;
      }

      if (!foundNo && !foundError) {
        // -W<name>
        this->DiagLevels[name] = std::max(this->DiagLevels[name], DIAG_WARN);
      } else if (foundNo && !foundError) {
        // -Wno<name>
        this->DiagLevels[name] = DIAG_IGNORE;
      } else if (!foundNo && foundError) {
        // -Werror=<name>
        this->DiagLevels[name] = DIAG_ERROR;
      } else {
        // -Wno-error=<name>
        this->DiagLevels[name] = std::min(this->DiagLevels[name], DIAG_WARN);
      }
    } else if (arg.find("-U", 0) == 0) {
      std::string entryPattern = arg.substr(2);
      if (entryPattern.empty()) {
        ++i;
        if (i < args.size()) {
          entryPattern = args[i];
        } else {
          cmSystemTools::Error("-U must be followed with VAR.");
          return false;
        }
      }
      cmsys::RegularExpression regex(
        cmsys::Glob::PatternToRegex(entryPattern, true, true).c_str());
      // go through all cache entries and collect the vars which will be
      // removed
      std::vector<std::string> entriesToDelete;
      std::vector<std::string> cacheKeys = this->State->GetCacheEntryKeys();
      for (std::vector<std::string>::const_iterator it = cacheKeys.begin();
           it != cacheKeys.end(); ++it) {
        cmStateEnums::CacheEntryType t = this->State->GetCacheEntryType(*it);
        if (t != cmStateEnums::STATIC) {
          if (regex.find(it->c_str())) {
            entriesToDelete.push_back(*it);
          }
        }
      }

      // now remove them from the cache
      for (std::vector<std::string>::const_iterator currentEntry =
             entriesToDelete.begin();
           currentEntry != entriesToDelete.end(); ++currentEntry) {
        this->State->RemoveCacheEntry(*currentEntry);
      }
    } else if (arg.find("-C", 0) == 0) {
      std::string path = arg.substr(2);
      if (path.empty()) {
        ++i;
        if (i < args.size()) {
          path = args[i];
        } else {
          cmSystemTools::Error("-C must be followed by a file name.");
          return false;
        }
      }
      std::cout << "loading initial cache file " << path << "\n";
      this->ReadListFile(args, path.c_str());
    } else if (arg.find("-P", 0) == 0) {
      i++;
      if (i >= args.size()) {
        cmSystemTools::Error("-P must be followed by a file name.");
        return false;
      }
      std::string path = args[i];
      if (path.empty()) {
        cmSystemTools::Error("No cmake script provided.");
        return false;
      }
      // Register fake project commands that hint misuse in script mode.
      GetProjectCommandsInScriptMode(this->State);
      this->ReadListFile(args, path.c_str());
    } else if (arg.find("--find-package", 0) == 0) {
      findPackageMode = true;
    }
  }

  if (findPackageMode) {
    return this->FindPackage(args);
  }

  return true;
}